

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::PerformExtraUpdates(cmCTestScriptHandler *this)

{
  OutputOption outputflag;
  cmCTest *this_00;
  bool bVar1;
  size_type sVar2;
  reference args;
  ostream *poVar3;
  char *pcVar4;
  string_view arg;
  cmAlphaNum local_358;
  cmAlphaNum local_328;
  string local_2f8;
  rep_conflict local_2d8;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  ostringstream cmCTestLog_msg;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  undefined1 local_d8 [8];
  string fullCommand;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cvsArgs;
  string *eu;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int local_5c;
  undefined1 local_58 [3];
  bool res;
  int retVal;
  string output;
  string command;
  cmCTestScriptHandler *this_local;
  
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  std::__cxx11::string::operator=
            ((string *)(output.field_2._M_local_buf + 8),(string *)&this->UpdateCmd);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->ExtraUpdates);
  eu = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->ExtraUpdates);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&eu), bVar1) {
    cvsArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    arg = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)
                     cvsArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    fullCommand.field_2._8_8_ = arg._M_len;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,arg,false);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8);
    if (sVar2 == 2) {
      cmAlphaNum::cmAlphaNum(&local_108,(string *)((long)&output.field_2 + 8));
      cmAlphaNum::cmAlphaNum(&local_138," update ");
      args = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_a8,1);
      cmStrCat<std::__cxx11::string>((string *)local_d8,&local_108,&local_138,args);
      std::__cxx11::string::clear();
      local_5c = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
      poVar3 = std::operator<<((ostream *)local_2b0,"Run Update: ");
      poVar3 = std::operator<<(poVar3,(string *)local_d8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_00 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0x27e,pcVar4,false);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      outputflag = (this->super_cmCTestGenericHandler).HandlerVerbose;
      local_2d8 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar1 = cmSystemTools::RunSingleCommand
                        ((string *)local_d8,(string *)local_58,(string *)local_58,&local_5c,pcVar4,
                         outputflag,(cmDuration)local_2d8);
      if ((bVar1) && (local_5c == 0)) {
        bVar1 = false;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_328,"Unable to perform extra updates:\n");
        cmAlphaNum::cmAlphaNum
                  (&local_358,
                   cvsArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmStrCat<char[15],std::__cxx11::string>
                  (&local_2f8,&local_328,&local_358,(char (*) [15])"\nWith output:\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        cmSystemTools::Error(&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        this_local._4_4_ = 0;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_d8);
      if (!bVar1) goto LAB_0026cea2;
    }
    else {
LAB_0026cea2:
      bVar1 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
    if (bVar1) goto LAB_0026cef3;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._4_4_ = 0;
LAB_0026cef3:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::PerformExtraUpdates()
{
  std::string command;
  std::string output;
  int retVal;
  bool res;

  // do an initial cvs update as required
  command = this->UpdateCmd;
  for (std::string const& eu : this->ExtraUpdates) {
    std::vector<std::string> cvsArgs = cmExpandedList(eu);
    if (cvsArgs.size() == 2) {
      std::string fullCommand = cmStrCat(command, " update ", cvsArgs[1]);
      output.clear();
      retVal = 0;
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Run Update: " << fullCommand << std::endl);
      res = cmSystemTools::RunSingleCommand(
        fullCommand, &output, &output, &retVal, cvsArgs[0].c_str(),
        this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);
      if (!res || retVal != 0) {
        cmSystemTools::Error(cmStrCat("Unable to perform extra updates:\n", eu,
                                      "\nWith output:\n", output));
        return 0;
      }
    }
  }
  return 0;
}